

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int getPid(QString *package)

{
  Data *pDVar1;
  int *piVar2;
  int iVar3;
  QString *data;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QByteArrayView QVar8;
  QAnyStringView QVar9;
  bool ok;
  QArrayData *d;
  QByteArray local_d0;
  QByteArray local_b8;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<QByteArray> local_78;
  QArrayDataPointer<QByteArray> local_58;
  long local_40 [2];
  qsizetype aqStack_30 [2];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.d.size = 0;
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char *)0x0;
  QVar8.m_data = (storage_type *)0x5;
  QVar8.m_size = (qsizetype)&local_98;
  QString::fromLatin1(QVar8);
  local_58.d = (Data *)local_98.d;
  local_58.ptr = (QByteArray *)local_98.ptr;
  local_58.size = local_98.size;
  local_98.ptr = (QString *)(package->d).ptr;
  local_98.size = (package->d).size | 0x8000000000000000;
  local_98.d = (Data *)CONCAT71(local_98.d._1_7_,1);
  local_78.ptr = (QByteArray *)0x0;
  QVar9.m_size = (size_t)"ps | grep \' %1\'";
  QVar9.field_0.m_data = local_40;
  local_78.d = (Data *)&local_98;
  QtPrivate::argToQString(QVar9,0x400000000000000f,(ArgBase **)0x1);
  local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_98.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_98,0x18,0x10,2,KeepSize);
  local_98.size = 0;
  uVar4 = 0xffffffffffffffe8;
  do {
    pDVar1 = *(Data **)((long)local_40 + uVar4);
    local_98.ptr[local_98.size].d.d = pDVar1;
    local_98.ptr[local_98.size].d.ptr = *(char16_t **)((long)local_40 + uVar4 + 8);
    local_98.ptr[local_98.size].d.size = *(qsizetype *)((long)local_40 + uVar4 + 0x10);
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_98.size = local_98.size + 1;
    bVar7 = 0xffffffffffffffe7 < uVar4;
    uVar4 = uVar4 + 0x18;
  } while (bVar7);
  lVar6 = 0x18;
  do {
    piVar2 = *(int **)((long)&local_58.d + lVar6);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate(*(QArrayData **)((long)&local_58.d + lVar6),2,0x10);
      }
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  iVar5 = 0;
  bVar7 = execAdbCommand((QStringList *)&local_98,&local_b8,false);
  if (bVar7) {
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    QByteArray::split((char)&local_58);
    if (local_58.size == 0) {
      iVar5 = 0;
    }
    else {
      local_78.size = 0xaaaaaaaaaaaaaaaa;
      local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_78.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
      QByteArray::simplified_helper(&local_d0);
      QByteArray::replace((char)&local_d0,'\t');
      QByteArray::split((char)&local_78);
      piVar2 = (int *)CONCAT71(local_d0.d.d._1_7_,(char)local_d0.d.d);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT71(local_d0.d.d._1_7_,(char)local_d0.d.d),1,0x10);
        }
      }
      iVar5 = 0;
      if (2 < (ulong)local_78.size) {
        local_d0.d.d._0_1_ = '\0';
        iVar3 = QByteArray::toInt((bool *)(local_78.ptr + 1),(int)&local_d0);
        iVar5 = -1;
        if ((char)local_d0.d.d != '\0') {
          iVar5 = iVar3;
        }
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_78);
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_58);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

static int getPid(const QString &package)
{
    QByteArray output;
    const QStringList psArgs = { "shell"_L1, "ps | grep ' %1'"_L1.arg(package) };
    if (!execAdbCommand(psArgs, &output, false))
        return false;

    const QList<QByteArray> lines = output.split(u'\n');
    if (lines.size() < 1)
        return false;

    QList<QByteArray> columns = lines.first().simplified().replace(u'\t', u' ').split(u' ');
    if (columns.size() < 3)
        return false;

    bool ok = false;
    int pid = columns.at(1).toInt(&ok);
    if (ok)
        return pid;

    return -1;
}